

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

base_learner * OjaNewton_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  double dVar3;
  int *piVar4;
  options_i *poVar5;
  int iVar6;
  OjaNewton *__s;
  option_group_definition *poVar7;
  typed_option<int> *ptVar8;
  typed_option<float> *ptVar9;
  float *pfVar10;
  float **ppfVar11;
  ulong uVar12;
  example **ppeVar13;
  learner<OjaNewton,_example> *plVar14;
  uint32_t *puVar15;
  long lVar16;
  bool oja_newton;
  float alpha_inverse;
  string random_init;
  string normalize;
  option_group_definition new_options;
  bool local_d01;
  vw *local_d00;
  float local_cf4;
  free_ptr<OjaNewton> local_cf0;
  float *local_ce0;
  int *local_cd8;
  options_i *local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  undefined1 *local_c88 [2];
  undefined1 local_c78 [16];
  string local_c68;
  undefined1 *local_c48 [2];
  undefined1 local_c38 [16];
  string local_c28;
  undefined1 *local_c08 [2];
  undefined1 local_bf8 [16];
  string local_be8;
  undefined1 *local_bc8 [2];
  undefined1 local_bb8 [16];
  string local_ba8;
  undefined1 *local_b88 [2];
  undefined1 local_b78 [16];
  string local_b68;
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  string local_b28;
  undefined1 *local_b08;
  long local_b00;
  undefined1 local_af8 [16];
  option_group_definition local_ae8;
  undefined1 *local_ab0 [2];
  undefined1 local_aa0 [16];
  string local_a90;
  string local_a70;
  undefined1 *local_a50 [2];
  undefined1 local_a40 [16];
  undefined1 local_a30 [112];
  bool local_9c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  undefined1 local_990 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  undefined1 local_8f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  undefined1 local_850 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_710;
  typed_option<float> local_670;
  typed_option<float> local_5d0;
  typed_option<float> local_530;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<int> local_350;
  typed_option<int> local_2b0;
  typed_option<int> local_210;
  typed_option<int> local_170;
  typed_option<bool> local_d0;
  
  local_d00 = all;
  __s = calloc_or_throw<OjaNewton>(1);
  memset(__s,0,0xb0);
  local_cf0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<OjaNewton>;
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  local_cf0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>.
  _M_head_impl = __s;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"true","");
  local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"true","");
  local_b08 = local_af8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"OjaNewton options","");
  local_ae8.m_name._M_dataplus._M_p = (pointer)&local_ae8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_ae8,local_b08,local_b08 + local_b00);
  local_ae8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ae8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ae8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_b08 != local_af8) {
    operator_delete(local_b08);
  }
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b28,"OjaNewton","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_a30,&local_b28,&local_d01);
  local_9c0 = true;
  local_b48[0] = local_b38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b48,"Online Newton with Oja\'s Sketch","");
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_a30);
  poVar7 = VW::config::option_group_definition::add<bool>(&local_ae8,&local_d0);
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b68,"sketch_size","");
  VW::config::typed_option<int>::typed_option(&local_210,&local_b68,&__s->m);
  ptVar8 = VW::config::typed_option<int>::default_value(&local_210,10);
  local_b88[0] = local_b78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"size of sketch","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_170,ptVar8);
  poVar7 = VW::config::option_group_definition::add<int>(poVar7,&local_170);
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba8,"epoch_size","");
  VW::config::typed_option<int>::typed_option(&local_350,&local_ba8,&__s->epoch_size);
  ptVar8 = VW::config::typed_option<int>::default_value(&local_350,1);
  local_bc8[0] = local_bb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bc8,"size of epoch","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_2b0,ptVar8);
  poVar7 = VW::config::option_group_definition::add<int>(poVar7,&local_2b0);
  local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_be8,"alpha","");
  local_ce0 = &__s->alpha;
  VW::config::typed_option<float>::typed_option(&local_490,&local_be8,local_ce0);
  ptVar9 = VW::config::typed_option<float>::default_value(&local_490,1.0);
  local_c08[0] = local_bf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c08,"mutiplicative constant for indentiy","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3f0,ptVar9);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_3f0);
  local_c28._M_dataplus._M_p = (pointer)&local_c28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c28,"alpha_inverse","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_850,&local_c28,&local_cf4);
  local_c48[0] = local_c38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c48,"one over alpha, similar to learning rate","");
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_530,(typed_option<float> *)local_850);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_530);
  local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c68,"learning_rate_cnt","");
  VW::config::typed_option<float>::typed_option(&local_670,&local_c68,&__s->learning_rate_cnt);
  local_cd0 = options;
  ptVar9 = VW::config::typed_option<float>::default_value(&local_670,2.0);
  local_a50[0] = local_a40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a50,"constant for the learning rate 1/t","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_5d0,ptVar9);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_5d0);
  local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"normalize","");
  local_cd8 = &__s->epoch_size;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_8f0,&local_a70,&local_ca8);
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c88,"normalize the features or not","");
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_710,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_8f0);
  poVar7 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar7,&local_710);
  local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"random_init","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990,&local_a90,&local_cc8);
  local_ab0[0] = local_aa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ab0,"randomize initialization of Oja or not","");
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_7b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar7,&local_7b0);
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0198;
  if (local_7b0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_7b0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_ab0[0] != local_aa0) {
    operator_delete(local_ab0[0]);
  }
  local_990._0_8_ = &PTR__typed_option_002d0198;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
    operator_delete(local_a90._M_dataplus._M_p);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0198;
  if (local_710.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_710.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_c88[0] != local_c78) {
    operator_delete(local_c88[0]);
  }
  local_8f0._0_8_ = &PTR__typed_option_002d0198;
  if (local_858._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_858._M_pi);
  }
  if (local_868._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_868._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0278;
  if (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_a50[0] != local_a40) {
    operator_delete(local_a50[0]);
  }
  poVar5 = local_cd0;
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0278;
  if (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0278;
  if (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_c48[0] != local_c38) {
    operator_delete(local_c48[0]);
  }
  local_850._0_8_ = &PTR__typed_option_002d0278;
  if (local_7b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8._M_pi);
  }
  if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_850);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
    operator_delete(local_c28._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0278;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_c08[0] != local_bf8) {
    operator_delete(local_c08[0]);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0278;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
    operator_delete(local_be8._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0aa8;
  if (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_bc8[0] != local_bb8) {
    operator_delete(local_bc8[0]);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0aa8;
  if (local_350.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0aa8;
  if (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_b88[0] != local_b78) {
    operator_delete(local_b88[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0aa8;
  if (local_210.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0130;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_b48[0] != local_b38) {
    operator_delete(local_b48[0]);
  }
  local_a30._0_8_ = &PTR__typed_option_002d0130;
  if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
  }
  if (local_9a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p);
  }
  (**poVar5->_vptr_options_i)(poVar5,&local_ae8);
  pp_Var1 = (_func_int **)(local_a30 + 0x10);
  local_a30._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"OjaNewton","");
  iVar6 = (*poVar5->_vptr_options_i[1])(poVar5,local_a30);
  if ((_func_int **)local_a30._0_8_ != pp_Var1) {
    operator_delete((void *)local_a30._0_8_);
  }
  if ((char)iVar6 == '\0') {
    plVar14 = (learner<OjaNewton,_example> *)0x0;
  }
  else {
    __s->all = local_d00;
    iVar6 = std::__cxx11::string::compare((char *)&local_ca8);
    __s->normalize = iVar6 == 0;
    iVar6 = std::__cxx11::string::compare((char *)&local_cc8);
    __s->random_init = iVar6 == 0;
    local_a30._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"alpha_inverse","");
    iVar6 = (*poVar5->_vptr_options_i[1])(poVar5,local_a30);
    if ((_func_int **)local_a30._0_8_ != pp_Var1) {
      operator_delete((void *)local_a30._0_8_);
    }
    if ((char)iVar6 != '\0') {
      *local_ce0 = 1.0 / local_cf4;
    }
    __s->cnt = 0;
    __s->t = 1;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->ev = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->b = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->D = pfVar10;
    ppfVar11 = calloc_or_throw<float*>((long)__s->m + 1);
    __s->A = ppfVar11;
    ppfVar11 = calloc_or_throw<float*>((long)__s->m + 1);
    piVar4 = local_cd8;
    __s->K = ppfVar11;
    uVar12 = (ulong)(uint)__s->m;
    if (0 < __s->m) {
      lVar16 = 0;
      do {
        pfVar10 = calloc_or_throw<float>((long)((int)uVar12 + 1));
        __s->A[lVar16 + 1] = pfVar10;
        pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
        __s->K[lVar16 + 1] = pfVar10;
        __s->A[lVar16 + 1][lVar16 + 1] = 1.0;
        __s->K[lVar16 + 1][lVar16 + 1] = 1.0;
        __s->D[lVar16 + 1] = 1.0;
        uVar12 = (ulong)__s->m;
        lVar16 = lVar16 + 1;
      } while (lVar16 < (long)uVar12);
    }
    ppeVar13 = calloc_or_throw<example*>((long)*piVar4);
    __s->buffer = ppeVar13;
    pfVar10 = calloc_or_throw<float>((long)__s->epoch_size);
    __s->weight_buffer = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->zv = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->vv = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->tmp = pfVar10;
    (__s->data).ON = __s;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    (__s->data).Zx = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    (__s->data).AZx = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    (__s->data).delta = pfVar10;
    dVar3 = log2((double)(__s->m + 2));
    dVar3 = ceil(dVar3);
    uVar12 = (ulong)dVar3;
    if ((local_d00->weights).sparse == true) {
      sparse_parameters::stride_shift(&(local_d00->weights).sparse_weights,(uint32_t)uVar12);
      puVar15 = &(local_d00->weights).dense_weights._stride_shift;
      if (((local_d00->weights).sparse & 1U) != 0) {
        puVar15 = &(local_d00->weights).sparse_weights._stride_shift;
      }
      uVar12 = (ulong)*puVar15;
    }
    else {
      (local_d00->weights).dense_weights._stride_shift = (uint32_t)uVar12;
    }
    plVar14 = LEARNER::init_learner<OjaNewton,example,LEARNER::learner<char,char>>
                        (&local_cf0,learn,predict,(ulong)(uint)(1 << ((byte)uVar12 & 0x1f)));
    *(code **)(plVar14 + 0x80) = save_load;
    uVar2 = *(undefined8 *)(plVar14 + 0x18);
    *(undefined8 *)(plVar14 + 0x70) = uVar2;
    *(undefined8 *)(plVar14 + 0x78) = *(undefined8 *)(plVar14 + 0x20);
    *(undefined8 *)(plVar14 + 0x58) = uVar2;
    *(code **)(plVar14 + 0x68) = keep_example;
    *(undefined8 *)(plVar14 + 0xb8) = uVar2;
    *(undefined8 *)(plVar14 + 0xc0) = *(undefined8 *)(plVar14 + 0x20);
    *(code **)(plVar14 + 200) = finish;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_ae8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8.m_name._M_dataplus._M_p != &local_ae8.m_name.field_2) {
    operator_delete(local_ae8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p);
  }
  if (local_cf0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl != (OjaNewton *)0x0) {
    (*(code *)local_cf0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_cf0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar14;
}

Assistant:

base_learner* OjaNewton_setup(options_i& options, vw& all)
{
  auto ON = scoped_calloc_or_throw<OjaNewton>();

  bool oja_newton;
  float alpha_inverse;

  // These two are the only two boolean options that default to true. For now going to do this hack
  // as the infrastructure doesn't easily support this possibility at the same time providing the
  // ease of bool switches elsewhere. It seems that the switch behavior is more critical because
  // of the positional data argument.
  std::string normalize = "true";
  std::string random_init = "true";
  option_group_definition new_options("OjaNewton options");
  new_options.add(make_option("OjaNewton", oja_newton).keep().help("Online Newton with Oja's Sketch"))
      .add(make_option("sketch_size", ON->m).default_value(10).help("size of sketch"))
      .add(make_option("epoch_size", ON->epoch_size).default_value(1).help("size of epoch"))
      .add(make_option("alpha", ON->alpha).default_value(1.f).help("mutiplicative constant for indentiy"))
      .add(make_option("alpha_inverse", alpha_inverse).help("one over alpha, similar to learning rate"))
      .add(make_option("learning_rate_cnt", ON->learning_rate_cnt)
               .default_value(2.f)
               .help("constant for the learning rate 1/t"))
      .add(make_option("normalize", normalize).help("normalize the features or not"))
      .add(make_option("random_init", random_init).help("randomize initialization of Oja or not"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("OjaNewton"))
    return nullptr;

  ON->all = &all;

  ON->normalize = normalize == "true";
  ON->random_init = random_init == "true";

  if (options.was_supplied("alpha_inverse"))
    ON->alpha = 1.f / alpha_inverse;

  ON->cnt = 0;
  ON->t = 1;
  ON->ev = calloc_or_throw<float>(ON->m + 1);
  ON->b = calloc_or_throw<float>(ON->m + 1);
  ON->D = calloc_or_throw<float>(ON->m + 1);
  ON->A = calloc_or_throw<float*>(ON->m + 1);
  ON->K = calloc_or_throw<float*>(ON->m + 1);
  for (int i = 1; i <= ON->m; i++)
  {
    ON->A[i] = calloc_or_throw<float>(ON->m + 1);
    ON->K[i] = calloc_or_throw<float>(ON->m + 1);
    ON->A[i][i] = 1;
    ON->K[i][i] = 1;
    ON->D[i] = 1;
  }

  ON->buffer = calloc_or_throw<example*>(ON->epoch_size);
  ON->weight_buffer = calloc_or_throw<float>(ON->epoch_size);

  ON->zv = calloc_or_throw<float>(ON->m + 1);
  ON->vv = calloc_or_throw<float>(ON->m + 1);
  ON->tmp = calloc_or_throw<float>(ON->m + 1);

  ON->data.ON = ON.get();
  ON->data.Zx = calloc_or_throw<float>(ON->m + 1);
  ON->data.AZx = calloc_or_throw<float>(ON->m + 1);
  ON->data.delta = calloc_or_throw<float>(ON->m + 1);

  all.weights.stride_shift((uint32_t)ceil(log2(ON->m + 2)));

  learner<OjaNewton, example>& l = init_learner(ON, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_finish_example(keep_example);
  l.set_finish(finish);
  return make_base(l);
}